

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O2

int Fxch_DivRemoveLits(Vec_Int_t *vCube0,Vec_Int_t *vCube1,Vec_Int_t *vDiv,int *fCompl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  
  iVar10 = 0;
  iVar7 = 0;
  for (iVar9 = 0; iVar2 = vDiv->nSize, iVar9 < iVar2; iVar9 = iVar9 + 1) {
    iVar1 = Vec_IntEntry(vDiv,iVar9);
    iVar2 = Abc_Lit2Var(iVar1);
    iVar2 = Abc_LitIsCompl(iVar2);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar3 = Vec_IntRemove1(vCube0,iVar1);
    iVar1 = iVar3;
    if (iVar2 != 0) {
      iVar1 = 0;
      iVar2 = iVar3;
    }
    iVar10 = iVar10 + iVar2;
    iVar7 = iVar7 + iVar1;
  }
  iVar9 = 0;
  for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vDiv,iVar1);
    iVar2 = Abc_Lit2Var(iVar2);
    iVar2 = Vec_IntRemove1(vCube1,iVar2);
    iVar9 = iVar9 + iVar2;
    iVar2 = vDiv->nSize;
  }
  if (iVar2 == 2) {
    iVar2 = 2;
    for (iVar1 = 0; iVar1 < iVar2; iVar1 = iVar1 + 1) {
      iVar2 = Vec_IntEntry(vDiv,iVar1);
      iVar3 = Abc_Lit2Var(iVar2);
      iVar3 = Abc_LitNot(iVar3);
      Vec_IntRemove1(vCube0,iVar3);
      iVar2 = Abc_Lit2Var(iVar2);
      iVar2 = Abc_LitNot(iVar2);
      Vec_IntRemove1(vCube1,iVar2);
      iVar2 = vDiv->nSize;
    }
  }
  iVar9 = iVar7 + iVar10 + iVar9;
  if (iVar2 == 4) {
    iVar7 = Vec_IntEntry(vDiv,0);
    iVar2 = Abc_Lit2Var(iVar7);
    iVar7 = Vec_IntEntry(vDiv,1);
    iVar1 = Abc_Lit2Var(iVar7);
    iVar7 = 2;
    iVar3 = Vec_IntEntry(vDiv,2);
    iVar3 = Abc_Lit2Var(iVar3);
    iVar4 = Vec_IntEntry(vDiv,3);
    iVar4 = Abc_Lit2Var(iVar4);
    iVar5 = Abc_LitNot(iVar1);
    if (((iVar2 == iVar5) && (iVar4 = Abc_LitNot(iVar4), iVar3 == iVar4)) && (iVar10 == 1)) {
      *fCompl = 1;
    }
    iVar10 = Abc_LitNot(iVar1);
    if ((iVar2 == iVar10) && (iVar9 == 2)) {
      *fCompl = 1;
      for (uVar8 = 0; iVar10 = vDiv->nSize, (int)uVar8 < iVar10; uVar8 = uVar8 + 1) {
        iVar9 = Vec_IntEntry(vDiv,uVar8);
        uVar6 = Abc_Lit2Var(iVar9);
        iVar9 = Vec_IntRemove1(vCube0,1 < uVar8 ^ uVar6);
        iVar7 = iVar7 + iVar9;
      }
      iVar9 = iVar7;
      for (uVar8 = 0; (int)uVar8 < iVar10; uVar8 = uVar8 + 1) {
        iVar7 = Vec_IntEntry(vDiv,uVar8);
        uVar6 = Abc_Lit2Var(iVar7);
        iVar7 = Vec_IntRemove1(vCube1,1 < uVar8 ^ uVar6);
        iVar9 = iVar9 + iVar7;
        iVar10 = vDiv->nSize;
      }
    }
  }
  return iVar9;
}

Assistant:

int Fxch_DivRemoveLits( Vec_Int_t* vCube0,
                        Vec_Int_t* vCube1,
                        Vec_Int_t* vDiv,
                        int *fCompl )
{
    int i,
        Lit,
        CountP = 0,
        CountN = 0,
        Count = 0,
        ret = 0;

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Abc_Lit2Var( Lit ) ) )
            CountN += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );
        else
            CountP += Vec_IntRemove1( vCube0, Abc_Lit2Var( Lit ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        Count += Vec_IntRemove1( vCube1, Abc_Lit2Var( Lit ) );

   if ( Vec_IntSize( vDiv ) == 2 )
       Vec_IntForEachEntry( vDiv, Lit, i )
       {
           Vec_IntRemove1( vCube0, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
           Vec_IntRemove1( vCube1, Abc_LitNot( Abc_Lit2Var( Lit ) ) );
       }

    ret = Count + CountP + CountN;

    if ( Vec_IntSize( vDiv ) == 4 )
    {
        int Lit0 = Abc_Lit2Var( Vec_IntEntry( vDiv, 0 ) ),
            Lit1 = Abc_Lit2Var( Vec_IntEntry( vDiv, 1 ) ),
            Lit2 = Abc_Lit2Var( Vec_IntEntry( vDiv, 2 ) ),
            Lit3 = Abc_Lit2Var( Vec_IntEntry( vDiv, 3 ) );

        if ( Lit0 == Abc_LitNot( Lit1 ) && Lit2 == Abc_LitNot( Lit3 ) && CountN == 1 )
            *fCompl = 1;

        if ( Lit0 == Abc_LitNot( Lit1 ) && ret == 2 )
        {
            *fCompl = 1;

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube0, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );

            Vec_IntForEachEntry( vDiv, Lit, i )
                ret += Vec_IntRemove1( vCube1, ( Abc_Lit2Var( Lit ) ^ (fCompl && i > 1) ) );
        }
    }

    return ret;
}